

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O0

void __thiscall Ptex::v2_2::PtexSeparableKernel::rotate(PtexSeparableKernel *this,int rotVal)

{
  uint uVar1;
  uint in_ESI;
  long in_RDI;
  
  uVar1 = in_ESI & 3;
  if (uVar1 == 1) {
    flipU((PtexSeparableKernel *)(CONCAT44(in_ESI,in_ESI) & 0xffffffff00000003));
    swapUV((PtexSeparableKernel *)CONCAT44(in_ESI,uVar1));
  }
  else if (uVar1 == 2) {
    flipU((PtexSeparableKernel *)(CONCAT44(in_ESI,in_ESI) & 0xffffffff00000003));
    flipV((PtexSeparableKernel *)CONCAT44(in_ESI,uVar1));
  }
  else {
    if (uVar1 != 3) {
      return;
    }
    flipV((PtexSeparableKernel *)(CONCAT44(in_ESI,in_ESI) & 0xffffffff00000003));
    swapUV((PtexSeparableKernel *)CONCAT44(in_ESI,uVar1));
  }
  *(uint *)(in_RDI + 0x78) = *(int *)(in_RDI + 0x78) + in_ESI & 3;
  return;
}

Assistant:

void rotate(int rotVal)
    {
        // rotate kernel 'rot' steps ccw
        switch (rotVal & 3) {
        default: return;
        case 1: flipU(); swapUV(); break;
        case 2: flipU(); flipV(); break;
        case 3: flipV(); swapUV(); break;
        }
        rot = (rot + rotVal)&3;
    }